

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glsShaderRenderCase.hpp
# Opt level: O3

LineStream * __thiscall deqp::gls::LineStream::operator<<(LineStream *this,char *line)

{
  ostringstream *poVar1;
  size_t sVar2;
  int iVar3;
  
  if (0 < this->m_indent) {
    iVar3 = 0;
    do {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&this->m_stream,"\t",1);
      iVar3 = iVar3 + 1;
    } while (iVar3 < this->m_indent);
  }
  poVar1 = &this->m_stream;
  if (line == (char *)0x0) {
    std::ios::clear((int)poVar1 + (int)*(undefined8 *)(*(long *)poVar1 + -0x18));
  }
  else {
    sVar2 = strlen(line);
    std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,line,sVar2);
  }
  std::__ostream_insert<char,std::char_traits<char>>((ostream *)poVar1,"\n",1);
  return this;
}

Assistant:

LineStream&			operator<<		(const char* line)	{ for (int i = 0; i < m_indent; i++) { m_stream << "\t"; } m_stream << line << "\n"; return *this; }